

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_vcontainer(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint32_t *puVar2;
  
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_vb_index = *puVar2;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_vb_offset = *puVar2;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  this->m_ext_vb_size = *puVar2;
  pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 1);
  *pbVar1 = *pbVar1 | 4;
  return;
}

Assistant:

inline uint32_t xr_reader::r_u32() { return *m_p_u32++; }